

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

uint gl4cts::ShaderSubroutine::Utils::getComponentSizeForVariableType(_variable_type *variable_type)

{
  uint uVar1;
  _variable_type _Var2;
  TestError *this;
  
  _Var2 = getBaseVariableType(variable_type);
  switch(_Var2) {
  case VARIABLE_TYPE_BOOL:
    uVar1 = 1;
    break;
  case VARIABLE_TYPE_BVEC2:
  case VARIABLE_TYPE_BVEC3:
  case VARIABLE_TYPE_BVEC4:
  case VARIABLE_TYPE_DVEC2:
  case VARIABLE_TYPE_DVEC3:
  case VARIABLE_TYPE_DVEC4:
switchD_00a103e2_caseD_1:
    this = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this,"Unrecognized base variable type",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
               ,0x439);
    __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  case VARIABLE_TYPE_DOUBLE:
    uVar1 = 8;
    break;
  default:
    if (_Var2 != VARIABLE_TYPE_UINT) goto switchD_00a103e2_caseD_1;
  case VARIABLE_TYPE_FLOAT:
  case VARIABLE_TYPE_INT:
    uVar1 = 4;
  }
  return uVar1;
}

Assistant:

unsigned int Utils::getComponentSizeForVariableType(const _variable_type& variable_type)
{
	_variable_type base_variable_type = getBaseVariableType(variable_type);
	unsigned int   result			  = 0;

	switch (base_variable_type)
	{
	case VARIABLE_TYPE_BOOL:
		result = sizeof(bool);
		break;
	case VARIABLE_TYPE_DOUBLE:
		result = sizeof(double);
		break;
	case VARIABLE_TYPE_FLOAT:
		result = sizeof(float);
		break;
	case VARIABLE_TYPE_INT:
		result = sizeof(int);
		break;
	case VARIABLE_TYPE_UINT:
		result = sizeof(unsigned int);
		break;

	default:
	{
		TCU_FAIL("Unrecognized base variable type");
	}
	} /* switch (variable_type) */

	return result;
}